

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O0

void P_Spawn3DFloors(void)

{
  line_t *local_18;
  line_t *line;
  int i;
  
  line._4_4_ = 0;
  local_18 = lines;
  do {
    if (numlines <= line._4_4_) {
      for (line._4_4_ = 0; line._4_4_ < numsectors; line._4_4_ = line._4_4_ + 1) {
        P_Recalculate3DFloors(sectors + line._4_4_);
      }
      return;
    }
    if (local_18->special == 0x32) {
      if ((local_18->args[1] < 0) || (2 < local_18->args[1])) {
        local_18->args[1] = 0;
      }
      P_Set3DFloor(local_18,3,P_Spawn3DFloors::flagvals[local_18->args[1]],0);
LAB_0060268c:
      local_18->special = 0;
      local_18->args[4] = 0;
      local_18->args[3] = 0;
      local_18->args[2] = 0;
      local_18->args[1] = 0;
      local_18->args[0] = 0;
    }
    else if (local_18->special == 0xa0) {
      if (level.maptype == MAPTYPE_HEXEN) {
        if ((local_18->args[1] & 8U) == 0) {
          local_18->args[0] = local_18->args[4] * 0x100 + local_18->args[0];
          local_18->args[4] = 0;
        }
        else {
          FTagManager::AddLineID(&tagManager,line._4_4_,local_18->args[4]);
        }
      }
      P_Set3DFloor(local_18,local_18->args[1] & 0xfffffff7,local_18->args[2],local_18->args[3]);
      goto LAB_0060268c;
    }
    line._4_4_ = line._4_4_ + 1;
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

void P_Spawn3DFloors (void)
{
	static int flagvals[] = {512, 2+512, 512+1024};
	int i;
	line_t * line;

	for (i=0,line=lines;i<numlines;i++,line++)
	{
		switch(line->special)
		{
		case ExtraFloor_LightOnly:
			if (line->args[1] < 0 || line->args[1] > 2) line->args[1] = 0;
			P_Set3DFloor(line, 3, flagvals[line->args[1]], 0);
			break;

		case Sector_Set3DFloor:
			// The flag high-byte/line id is only needed in Hexen format.
			// UDMF can set both of these parameters without any restriction of the usable values.
			// In Doom format the translators can take full integers for the tag and the line ID always is the same as the tag.
			if (level.maptype == MAPTYPE_HEXEN)	
			{
				if (line->args[1]&8)
				{
					tagManager.AddLineID(i, line->args[4]);
				}
				else
				{
					line->args[0]+=256*line->args[4];
					line->args[4]=0;
				}
			}
			P_Set3DFloor(line, line->args[1]&~8, line->args[2], line->args[3]);
			break;

		default:
			continue;
		}
		line->special=0;
		line->args[0] = line->args[1] = line->args[2] = line->args[3] = line->args[4] = 0;
	}
	// kg3D - do it in software
	for (i = 0; i < numsectors; i++)
	{
		P_Recalculate3DFloors(&sectors[i]);
	}
}